

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.hpp
# Opt level: O0

bool ruckig::Block::calculate_block<6ul,true>
               (Block *block,array<ruckig::Profile,_6UL> *valid_profiles,
               size_t valid_profile_counter)

{
  Direction DVar1;
  array<ruckig::Profile,_6UL> *paVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  const_iterator pvVar6;
  const_iterator pvVar7;
  array<double,_7UL> *paVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  Interval local_e60;
  Interval local_c10;
  Interval local_9c0;
  Interval local_770;
  ulong local_520;
  size_t idx_else_4;
  size_t idx_else_3;
  size_t idx_else_2_1;
  size_t idx_else_1_2;
  size_type local_2b0;
  size_t idx_else_2;
  size_t idx_else_1_1;
  size_t idx_min;
  Profile *local_290;
  Profile *idx_min_it;
  ulong local_38;
  size_t idx_else_1;
  size_t idx_min_1;
  size_t valid_profile_counter_local;
  array<ruckig::Profile,_6UL> *valid_profiles_local;
  Block *block_local;
  
  idx_min_1 = valid_profile_counter;
  valid_profile_counter_local = (size_t)valid_profiles;
  valid_profiles_local = (array<ruckig::Profile,_6UL> *)block;
  if (valid_profile_counter == 1) {
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[](valid_profiles,0);
    set_min_profile(block,pvVar3);
    return true;
  }
  if (valid_profile_counter == 2) {
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[](valid_profiles,0);
    std::array<double,_7UL>::back(&pvVar3->t_sum);
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,1);
    paVar8 = &pvVar3->t_sum;
    std::array<double,_7UL>::back(paVar8);
    std::abs((int)paVar8);
    dVar9 = std::numeric_limits<double>::epsilon();
    paVar2 = valid_profiles_local;
    if (extraout_XMM0_Qa < dVar9 * 8.0) {
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,0);
      set_min_profile((Block *)paVar2,pvVar3);
      return true;
    }
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,0);
    pvVar4 = std::array<double,_7UL>::back(&pvVar3->t_sum);
    dVar9 = *pvVar4;
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,1);
    pvVar4 = std::array<double,_7UL>::back(&pvVar3->t_sum);
    paVar2 = valid_profiles_local;
    idx_else_1 = (size_t)(int)(uint)(*pvVar4 <= dVar9);
    local_38 = idx_else_1 + 1 & 1;
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_1);
    set_min_profile((Block *)paVar2,pvVar3);
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_1);
    pvVar5 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,local_38);
    Interval::Interval((Interval *)&idx_min_it,pvVar3,pvVar5);
    std::optional<ruckig::Block::Interval>::operator=
              ((optional<ruckig::Block::Interval> *)
               (valid_profiles_local->_M_elems[1].t._M_elems + 1),(Interval *)&idx_min_it);
    return true;
  }
  if (valid_profile_counter == 4) {
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[](valid_profiles,0);
    std::array<double,_7UL>::back(&pvVar3->t_sum);
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,1);
    paVar8 = &pvVar3->t_sum;
    std::array<double,_7UL>::back(paVar8);
    std::abs((int)paVar8);
    dVar9 = std::numeric_limits<double>::epsilon();
    if (extraout_XMM0_Qa_00 < dVar9 * 32.0) {
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,0);
      DVar1 = pvVar3->direction;
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,1);
      if (DVar1 != pvVar3->direction) {
        remove_profile<6ul>((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,&idx_min_1,1)
        ;
        goto LAB_002618ad;
      }
    }
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,2);
    std::array<double,_7UL>::back(&pvVar3->t_sum);
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,3);
    paVar8 = &pvVar3->t_sum;
    std::array<double,_7UL>::back(paVar8);
    std::abs((int)paVar8);
    dVar9 = std::numeric_limits<double>::epsilon();
    if (extraout_XMM0_Qa_01 < dVar9 * 256.0) {
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,2);
      DVar1 = pvVar3->direction;
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,3);
      if (DVar1 != pvVar3->direction) {
        remove_profile<6ul>((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,&idx_min_1,3)
        ;
        goto LAB_002618ad;
      }
    }
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,0);
    std::array<double,_7UL>::back(&pvVar3->t_sum);
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,3);
    paVar8 = &pvVar3->t_sum;
    std::array<double,_7UL>::back(paVar8);
    std::abs((int)paVar8);
    dVar9 = std::numeric_limits<double>::epsilon();
    if (extraout_XMM0_Qa_02 < dVar9 * 256.0) {
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,0);
      DVar1 = pvVar3->direction;
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,3);
      if (DVar1 != pvVar3->direction) {
        remove_profile<6ul>((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,&idx_min_1,3)
        ;
        goto LAB_002618ad;
      }
    }
    block_local._7_1_ = false;
  }
  else {
    if ((valid_profile_counter & 1) == 0) {
      return false;
    }
LAB_002618ad:
    pvVar6 = std::array<ruckig::Profile,_6UL>::cbegin
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local);
    pvVar7 = std::array<ruckig::Profile,_6UL>::cbegin
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local);
    local_290 = std::
                min_element<ruckig::Profile_const*,ruckig::Block::calculate_block<6ul,true>(ruckig::Block&,std::array<ruckig::Profile,6ul>&,unsigned_long)::_lambda(ruckig::Profile_const&,ruckig::Profile_const&)_1_>
                          (pvVar6,pvVar7 + idx_min_1);
    pvVar6 = std::array<ruckig::Profile,_6UL>::cbegin
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local);
    idx_else_1_1 = std::distance<ruckig::Profile_const*>(pvVar6,local_290);
    paVar2 = valid_profiles_local;
    pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                       ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_1_1);
    set_min_profile((Block *)paVar2,pvVar3);
    if (idx_min_1 == 3) {
      idx_else_2 = (idx_else_1_1 + 1) % 3;
      local_2b0 = (idx_else_1_1 + 2) % 3;
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_2);
      pvVar5 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,local_2b0);
      Interval::Interval((Interval *)&idx_else_1_2,pvVar3,pvVar5);
      std::optional<ruckig::Block::Interval>::operator=
                ((optional<ruckig::Block::Interval> *)
                 (valid_profiles_local->_M_elems[1].t._M_elems + 1),(Interval *)&idx_else_1_2);
      block_local._7_1_ = true;
    }
    else if (idx_min_1 == 5) {
      idx_else_2_1 = (idx_else_1_1 + 1) % 5;
      idx_else_3 = (idx_else_1_1 + 2) % 5;
      idx_else_4 = (idx_else_1_1 + 3) % 5;
      local_520 = (idx_else_1_1 + 4) % 5;
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_2_1);
      DVar1 = pvVar3->direction;
      pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                         ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_3);
      if (DVar1 == pvVar3->direction) {
        pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_2_1)
        ;
        pvVar5 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_3);
        Interval::Interval(&local_770,pvVar3,pvVar5);
        std::optional<ruckig::Block::Interval>::operator=
                  ((optional<ruckig::Block::Interval> *)
                   (valid_profiles_local->_M_elems[1].t._M_elems + 1),&local_770);
        pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_4);
        pvVar5 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,local_520);
        Interval::Interval(&local_9c0,pvVar3,pvVar5);
        std::optional<ruckig::Block::Interval>::operator=
                  ((optional<ruckig::Block::Interval> *)
                   (valid_profiles_local->_M_elems[2].t._M_elems + 4),&local_9c0);
      }
      else {
        pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_2_1)
        ;
        pvVar5 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,local_520);
        Interval::Interval(&local_c10,pvVar3,pvVar5);
        std::optional<ruckig::Block::Interval>::operator=
                  ((optional<ruckig::Block::Interval> *)
                   (valid_profiles_local->_M_elems[1].t._M_elems + 1),&local_c10);
        pvVar3 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_3);
        pvVar5 = std::array<ruckig::Profile,_6UL>::operator[]
                           ((array<ruckig::Profile,_6UL> *)valid_profile_counter_local,idx_else_4);
        Interval::Interval(&local_e60,pvVar3,pvVar5);
        std::optional<ruckig::Block::Interval>::operator=
                  ((optional<ruckig::Block::Interval> *)
                   (valid_profiles_local->_M_elems[2].t._M_elems + 4),&local_e60);
      }
      block_local._7_1_ = true;
    }
    else {
      block_local._7_1_ = false;
    }
  }
  return block_local._7_1_;
}

Assistant:

static bool calculate_block(Block& block, std::array<Profile, N>& valid_profiles, size_t valid_profile_counter) {
        // std::cout << "---\n " << valid_profile_counter << std::endl;
        // for (size_t i = 0; i < valid_profile_counter; ++i) {
        //     std::cout << valid_profiles[i].t_sum.back() << " " << valid_profiles[i].to_string() << std::endl;
        // }

        if (valid_profile_counter == 1) {
            block.set_min_profile(valid_profiles[0]);
            return true;

        } else if (valid_profile_counter == 2) {
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 8 * std::numeric_limits<double>::epsilon()) {
                block.set_min_profile(valid_profiles[0]);
                return true;
            }

            if constexpr (numerical_robust) {
                const size_t idx_min = (valid_profiles[0].t_sum.back() < valid_profiles[1].t_sum.back()) ? 0 : 1;
                const size_t idx_else_1 = (idx_min + 1) % 2;

                block.set_min_profile(valid_profiles[idx_min]);
                block.a = Interval(valid_profiles[idx_min], valid_profiles[idx_else_1]);
                return true;
            }

        // Only happens due to numerical issues
        } else if (valid_profile_counter == 4) {
            // Find "identical" profiles
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 32 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[1].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 1);
            } else if (std::abs(valid_profiles[2].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[2].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else {
                return false;
            }

        } else if (valid_profile_counter % 2 == 0) {
            return false;
        }

        // Find index of fastest profile
        const auto idx_min_it = std::min_element(valid_profiles.cbegin(), valid_profiles.cbegin() + valid_profile_counter, [](const Profile& a, const Profile& b) { return a.t_sum.back() < b.t_sum.back(); });
        const size_t idx_min = std::distance(valid_profiles.cbegin(), idx_min_it);

        block.set_min_profile(valid_profiles[idx_min]);

        if (valid_profile_counter == 3) {
            const size_t idx_else_1 = (idx_min + 1) % 3;
            const size_t idx_else_2 = (idx_min + 2) % 3;

            block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
            return true;

        } else if (valid_profile_counter == 5) {
            const size_t idx_else_1 = (idx_min + 1) % 5;
            const size_t idx_else_2 = (idx_min + 2) % 5;
            const size_t idx_else_3 = (idx_min + 3) % 5;
            const size_t idx_else_4 = (idx_min + 4) % 5;

            if (valid_profiles[idx_else_1].direction == valid_profiles[idx_else_2].direction) {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
                block.b = Interval(valid_profiles[idx_else_3], valid_profiles[idx_else_4]);
            } else {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_4]);
                block.b = Interval(valid_profiles[idx_else_2], valid_profiles[idx_else_3]);
            }
            return true;
        }

        return false;
    }